

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BoxArray.cpp
# Opt level: O3

BoxArray * __thiscall amrex::BoxArray::grow(BoxArray *this,int n)

{
  int *piVar1;
  int *piVar2;
  undefined8 uVar3;
  element_type *peVar4;
  long lVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  
  uniqify(this);
  peVar4 = (this->m_ref).super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  lVar5 = *(long *)&(peVar4->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data;
  uVar9 = (int)((long)*(pointer *)
                       ((long)&(peVar4->m_abox).
                               super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                               super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                               super__Vector_impl_data + 8) - lVar5 >> 2) * -0x49249249;
  if (0 < (int)uVar9) {
    lVar10 = 0;
    do {
      piVar1 = (int *)(lVar5 + lVar10);
      iVar6 = piVar1[1];
      iVar7 = piVar1[2];
      iVar8 = piVar1[3];
      piVar2 = (int *)(lVar5 + lVar10);
      *piVar2 = *piVar1 - n;
      piVar2[1] = iVar6 - n;
      piVar2[2] = iVar7 - n;
      piVar2[3] = iVar8 + n;
      uVar3 = *(undefined8 *)(lVar5 + 0x10 + lVar10);
      *(ulong *)(lVar5 + 0x10 + lVar10) = CONCAT44((int)((ulong)uVar3 >> 0x20) + n,(int)uVar3 + n);
      lVar10 = lVar10 + 0x1c;
    } while ((ulong)(uVar9 & 0x7fffffff) * 0x1c != lVar10);
  }
  return this;
}

Assistant:

BoxArray&
BoxArray::grow (int n)
{
    uniqify();

    const int N = m_ref->m_abox.size();
#ifdef AMREX_USE_OMP
#pragma omp parallel for
#endif
    for (int i = 0; i < N; i++) {
        m_ref->m_abox[i].grow(n);
    }
    return *this;
}